

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_astDataType *
new_datatype_matrix(Context_conflict *ctx,MOJOSHADER_astDataType *dt,int rows,int columns)

{
  int iVar1;
  MOJOSHADER_astDataType *retval;
  MOJOSHADER_astDataType *local_28;
  
  local_28 = (MOJOSHADER_astDataType *)(*ctx->malloc)(0x20,ctx->malloc_data);
  if (local_28 == (MOJOSHADER_astDataType *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    iVar1 = buffer_append(ctx->garbage,&local_28,8);
    if (iVar1 != 0) {
      if (rows - 5U < 0xfffffffc) {
        failf(ctx,"%s","Matrix must have between 1 and 4 rows");
      }
      if (columns - 5U < 0xfffffffc) {
        failf(ctx,"%s","Matrix must have between 1 and 4 columns");
      }
      local_28->type = MOJOSHADER_AST_DATATYPE_MATRIX;
      (local_28->array).base = dt;
      (local_28->array).elements = rows;
      (local_28->matrix).columns = columns;
      return local_28;
    }
    (*ctx->free)(local_28,ctx->malloc_data);
  }
  return (MOJOSHADER_astDataType *)0x0;
}

Assistant:

static const MOJOSHADER_astDataType *new_datatype_matrix(Context *ctx,
                                            const MOJOSHADER_astDataType *dt,
                                            const int rows, const int columns)
{
    MOJOSHADER_astDataType *retval;
    // !!! FIXME: allocate enough for a matrix, but we need to cleanup things that copy without checking for subsize.
    retval = (MOJOSHADER_astDataType *) Malloc(ctx, sizeof (*retval));
    if (retval == NULL)
        return NULL;

    // !!! FIXME: this is hacky.
    // !!! FIXME:  I'd like to cache these anyhow and reuse types.
    if (!buffer_append(ctx->garbage, &retval, sizeof (retval)))
    {
        Free(ctx, retval);
        return NULL;
    } // if

    if ((rows < 1) || (rows > 4))
        fail(ctx, "Matrix must have between 1 and 4 rows");
    if ((columns < 1) || (columns > 4))
        fail(ctx, "Matrix must have between 1 and 4 columns");

    retval->type = MOJOSHADER_AST_DATATYPE_MATRIX;
    retval->matrix.base = dt;
    retval->matrix.rows = rows;
    retval->matrix.columns = columns;
    return retval;
}